

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor___decorate_internal_int__
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  undefined8 *puVar1;
  PClass *pPVar2;
  int iVar3;
  PClass *pPVar4;
  char *pcVar5;
  bool bVar6;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
  }
  else {
    if ((param->field_0).field_3.Type == '\x03') {
      puVar1 = (undefined8 *)(param->field_0).field_1.a;
      if ((param->field_0).field_1.atag == 1) {
        if (puVar1 != (undefined8 *)0x0) {
          pPVar4 = (PClass *)puVar1[1];
          if (pPVar4 == (PClass *)0x0) {
            pPVar4 = (PClass *)(**(code **)*puVar1)(puVar1);
            puVar1[1] = pPVar4;
          }
          bVar6 = pPVar4 != (PClass *)0x0;
          if (pPVar4 != pPVar2 && bVar6) {
            do {
              pPVar4 = pPVar4->ParentClass;
              bVar6 = pPVar4 != (PClass *)0x0;
              if (pPVar4 == pPVar2) break;
            } while (pPVar4 != (PClass *)0x0);
          }
          if (!bVar6) {
            pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_003c7d93;
          }
        }
LAB_003c7d42:
        if (numparam == 1) {
          pcVar5 = "(paramnum) < numparam";
        }
        else {
          if (param[1].field_0.field_3.Type == '\0') {
            if (numret < 1) {
              iVar3 = 0;
            }
            else {
              if (ret == (VMReturn *)0x0) {
                __assert_fail("ret != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                              ,0x2ec,
                              "int AF_AActor___decorate_internal_int__(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
              if (ret->RegType != '\0') {
                __assert_fail("RegType == REGT_INT",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                              ,0x13f,"void VMReturn::SetInt(int)");
              }
              *(int *)ret->Location = param[1].field_0.i;
              iVar3 = 1;
            }
            return iVar3;
          }
          pcVar5 = "param[paramnum].Type == REGT_INT";
        }
        __assert_fail(pcVar5,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x2eb,
                      "int AF_AActor___decorate_internal_int__(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      if (puVar1 == (undefined8 *)0x0) goto LAB_003c7d42;
    }
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003c7d93:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x2ea,
                "int AF_AActor___decorate_internal_int__(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, __decorate_internal_int__)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(returnme);
	ACTION_RETURN_INT(returnme);
}